

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboColorClearCase::render(FboColorClearCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  TextureChannelClass TVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  int ndx;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  Vec4 color;
  Vector<unsigned_int,_4> res;
  TextureFormat fboFormat;
  deUint32 rbo;
  deUint32 fbo;
  Random rnd;
  TextureFormatInfo fmtInfo;
  
  fboFormat = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  TVar5 = tcu::getTextureChannelClass(fboFormat.type);
  tcu::getTextureFormatInfo(&fmtInfo,&fboFormat);
  deRandom_init(&rnd.m_rnd,0x11);
  iVar9 = 0;
  fbo = 0;
  rbo = 0;
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&rbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,rbo);
  sglr::ContextWrapper::glRenderbufferStorage
            (this_00,0x8d41,(this->super_FboColorbufferCase).m_format,
             *(int *)&(this->super_FboColorbufferCase).field_0x8c,this->m_height);
  FboTestCase::checkError((FboTestCase *)this);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,rbo);
  FboTestCase::checkError((FboTestCase *)this);
  FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
  sglr::ContextWrapper::glViewport
            (this_00,0,0,*(int *)&(this->super_FboColorbufferCase).field_0x8c,this->m_height);
  switch((ulong)TVar5) {
  case 0:
  case 1:
  case 4:
    color.m_data[0] = 0.0;
    color.m_data[1] = 0.0;
    color.m_data[2] = 0.0;
    color.m_data[3] = 0.0;
    sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,color.m_data);
    break;
  case 2:
    color.m_data[0] = 0.0;
    color.m_data[1] = 0.0;
    color.m_data[2] = 0.0;
    color.m_data[3] = 0.0;
    sglr::ContextWrapper::glClearBufferiv(this_00,0x1800,0,(int *)&color);
    break;
  case 3:
    color.m_data[0] = 0.0;
    color.m_data[1] = 0.0;
    color.m_data[2] = 0.0;
    color.m_data[3] = 0.0;
    sglr::ContextWrapper::glClearBufferuiv(this_00,0x1800,0,(deUint32 *)&color);
  }
  sglr::ContextWrapper::glEnable(this_00,0xc11);
  while( true ) {
    uVar11 = *(uint *)&(this->super_FboColorbufferCase).field_0x8c;
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    uVar11 = dVar6 % uVar11;
    uVar10 = this->m_height;
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    uVar10 = dVar6 % uVar10;
    iVar3 = *(int *)&(this->super_FboColorbufferCase).field_0x8c;
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    iVar4 = this->m_height;
    dVar7 = deRandom_getUint32(&rnd.m_rnd);
    color.m_data[0] = 0.0;
    color.m_data[1] = 0.0;
    color.m_data[2] = 0.0;
    color.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      fVar1 = fmtInfo.valueMin.m_data[lVar8];
      fVar2 = fmtInfo.valueMax.m_data[lVar8];
      fVar12 = deRandom_getFloat(&rnd.m_rnd);
      color.m_data[lVar8] = fVar12 * (fVar2 - fVar1) + fVar1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    sglr::ContextWrapper::glScissor
              (this_00,uVar11,uVar10,dVar6 % (iVar3 - uVar11) + 1,dVar7 % (iVar4 - uVar10) + 1);
    if (TVar5 < TEXTURECHANNELCLASS_LAST) break;
    iVar9 = iVar9 + 1;
    if (iVar9 == 0x10) {
      FboTestCase::readPixels
                ((FboTestCase *)this,dst,0,0,*(int *)&(this->super_FboColorbufferCase).field_0x8c,
                 this->m_height,&fboFormat,&fmtInfo.lookupScale,&fmtInfo.lookupBias);
      FboTestCase::checkError((FboTestCase *)this);
      return;
    }
  }
  (*(code *)(&DAT_00b249d4 + *(int *)(&DAT_00b249d4 + (ulong)TVar5 * 4)))();
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat			fboFormat	= glu::mapGLInternalFormat(m_format);
		tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(fboFormat.type);
		tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(fboFormat);
		de::Random					rnd			(17);
		const int					numClears	= 16;
		deUint32					fbo			= 0;
		deUint32					rbo			= 0;

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);

		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, m_format, m_width, m_height);
		checkError();

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_width, m_height);

		// Initialize to transparent black.
		switch (fmtClass)
		{
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				glClearBufferfv(GL_COLOR, 0, Vec4(0.0f).getPtr());
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				glClearBufferuiv(GL_COLOR, 0, UVec4(0).getPtr());
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				glClearBufferiv(GL_COLOR, 0, IVec4(0).getPtr());
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		// Do random scissored clears.
		glEnable(GL_SCISSOR_TEST);
		for (int ndx = 0; ndx < numClears; ndx++)
		{
			int		x		= rnd.getInt(0, m_width		- 1);
			int		y		= rnd.getInt(0, m_height	- 1);
			int		w		= rnd.getInt(1, m_width		- x);
			int		h		= rnd.getInt(1, m_height	- y);
			Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glScissor(x, y, w, h);

			switch (fmtClass)
			{
				case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
				case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
					glClearBufferfv(GL_COLOR, 0, color.getPtr());
					break;

				case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
					glClearBufferuiv(GL_COLOR, 0, color.cast<deUint32>().getPtr());
					break;

				case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
					glClearBufferiv(GL_COLOR, 0, color.cast<int>().getPtr());
					break;

				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		// Read results from renderbuffer.
		readPixels(dst, 0, 0, m_width, m_height, fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}